

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_update_filter(bcf_hdr_t *hdr,bcf1_t *line,int *flt_ids,int n)

{
  int *piVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  if ((line->unpacked & 2) == 0) {
    bcf_unpack(line,2);
  }
  piVar1 = &(line->d).shared_dirty;
  *(byte *)piVar1 = (byte)*piVar1 | 4;
  (line->d).n_flt = n;
  if (n != 0) {
    if ((line->d).m_flt < n) {
      uVar3 = (int)(n - 1U) >> 1 | n - 1U;
      uVar3 = (int)uVar3 >> 2 | uVar3;
      uVar3 = (int)uVar3 >> 4 | uVar3;
      uVar3 = (int)uVar3 >> 8 | uVar3;
      uVar3 = (int)uVar3 >> 0x10 | uVar3;
      (line->d).m_flt = uVar3 + 1;
      piVar1 = (int *)realloc((line->d).flt,(long)(int)uVar3 * 4 + 4);
      (line->d).flt = piVar1;
    }
    uVar2 = 0;
    uVar4 = (ulong)(uint)n;
    if (n < 1) {
      uVar4 = uVar2;
    }
    for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      (line->d).flt[uVar2] = flt_ids[uVar2];
    }
  }
  return 0;
}

Assistant:

int bcf_update_filter(const bcf_hdr_t *hdr, bcf1_t *line, int *flt_ids, int n)
{
    if ( !(line->unpacked & BCF_UN_FLT) ) bcf_unpack(line, BCF_UN_FLT);
    line->d.shared_dirty |= BCF1_DIRTY_FLT;
    line->d.n_flt = n;
    if ( !n ) return 0;
    hts_expand(int, line->d.n_flt, line->d.m_flt, line->d.flt);
    int i;
    for (i=0; i<n; i++)
        line->d.flt[i] = flt_ids[i];
    return 0;
}